

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetDataBreakpointsResponse>::~BasicTypeInfo
          (BasicTypeInfo<dap::SetDataBreakpointsResponse> *this)

{
  BasicTypeInfo<dap::SetDataBreakpointsResponse> *this_local;
  
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}